

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main_p(int argc,char **argv)

{
  __u16 _Var1;
  __s32 _Var2;
  bool bVar3;
  __uid_t _Var4;
  __gid_t __gid;
  int iVar5;
  int *piVar6;
  off_t oVar7;
  XInputSimulator *this;
  ssize_t sVar8;
  int x;
  allocator local_91;
  input_event event;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  on_exit(exit_cleanup,(void *)0x0);
  process_command_line_arguments(argc,argv);
  _Var4 = geteuid();
  if (_Var4 != 0) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Got r00t?");
  }
  if (args.kill == true) {
    kill_existing_process();
  }
  if ((args.start == false) && (((byte)args.flags & 1) == 0)) {
    usage();
    exit(1);
  }
  oVar7 = args.post_size;
  if (args.post_size == 0) {
    if (args.irc_server._M_string_length == 0 && args.http_url._M_string_length == 0) {
      oVar7 = 0;
    }
    else {
      args.post_size = 500000;
      oVar7 = 500000;
    }
  }
  if (((args.keymap._M_string_length != 0) && (((byte)args.flags & 1) == 0)) &&
     (args.us_keymap == true)) {
    error(1,0,"Incompatible flags \'-m\' and \'-u\'. See usage.");
    oVar7 = args.post_size;
  }
  if ((oVar7 != 0) && (bVar3 = std::operator==(&args.logfile,"-"), bVar3)) {
    error(1,0,"Incompatible flags [--post-size | --post-http] and --output to stdout");
  }
  set_utf8_locale();
  if (((byte)args.flags & 1) == 0) {
    if (args.keymap._M_string_length == 0) {
      determine_system_keymap();
      goto LAB_00106d6e;
    }
  }
  else {
    if (args.us_keymap == false) {
      determine_system_keymap();
    }
    export_keymap_to_file();
  }
  parse_input_keymap();
LAB_00106d6e:
  if (args.device._M_string_length == 0) {
    determine_input_device();
  }
  else {
    std::__cxx11::string::rfind(-0x70,0x2f);
    std::__cxx11::string::string((string *)&local_50,"/dev/input/",&local_91);
    std::__cxx11::string::substr((ulong)&local_70,0x10cc90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&event,
                   &local_50,&local_70);
    std::__cxx11::string::operator=((string *)&args.device,(string *)&event);
    std::__cxx11::string::~string((string *)&event);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  set_signal_handling();
  close(0);
  input_fd = open(args.device._M_dataplus._M_p,0);
  if (input_fd == -1) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Error opening input event device \'%s\'",args.device._M_dataplus._M_p);
  }
  bVar3 = std::operator==(&args.logfile,"/var/log/logkeys.log");
  if (bVar3) {
    _Var4 = getuid();
    seteuid(_Var4);
    __gid = getgid();
    setegid(__gid);
  }
  this = XInputSimulator::getInstance();
  umask(0x7f);
  iVar5 = access("/var/run/logkeys.pid",0);
  if (iVar5 != -1) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Another process already running? Quitting. (/var/run/logkeys.pid)");
  }
  if ((((byte)args.flags & 0x40) == 0) && (iVar5 = daemon(0,1), iVar5 == -1)) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Failed to become daemon");
  }
  seteuid(0);
  setegid(0);
  if (((byte)args.flags & 0x40) == 0) {
    create_PID_file();
  }
  execute_abi_cxx11_((string *)&event,
                     "{ { xset q 2>/dev/null | grep -q -E \'Caps Lock: +on\'; } || { setleds 2>/dev/null | grep -q \'CapsLock on\'; }; } && echo on"
                    );
  std::__cxx11::string::~string((string *)&event);
LAB_00106ea4:
  do {
    sVar8 = read(input_fd,(string *)&event,0x18);
    _Var2 = event.value;
    _Var1 = event.code;
    if (sVar8 < 1) {
      exit(0);
    }
  } while (event.type != 1);
  if (enabled == true) goto code_r0x00106edd;
  goto LAB_00106f91;
code_r0x00106edd:
  if (1 < event.value - 1U) goto LAB_00106ea4;
  switch(event.code) {
  case 0x48:
switchD_00106f05_caseD_67:
    XInputSimulator::mouseMoveRelative(this,0,-0x14);
    if (_Var1 == 0x4b) goto switchD_00106f05_caseD_69;
    if (_Var1 == 0x4d) break;
    if (_Var1 != 0x50) goto switchD_00106f05_caseD_68;
    x = 0;
    iVar5 = 0x14;
    goto LAB_00106f68;
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4e:
  case 0x4f:
    goto switchD_00106f05_caseD_68;
  case 0x4b:
switchD_00106f05_caseD_69:
    XInputSimulator::mouseMoveRelative(this,-0x14,0);
    if (_Var1 != 0x4d) goto switchD_00106f05_caseD_68;
    break;
  case 0x4d:
    break;
  case 0x50:
switchD_00106f05_caseD_6c:
    XInputSimulator::mouseMoveRelative(this,0,0x14);
    if (_Var1 != 0x6a) {
      if (_Var1 != 0x69) goto switchD_00106f05_caseD_68;
      goto switchD_00106f05_caseD_69;
    }
    break;
  default:
    switch(event.code) {
    case 0x67:
      goto switchD_00106f05_caseD_67;
    default:
      goto switchD_00106f05_caseD_68;
    case 0x69:
      goto switchD_00106f05_caseD_69;
    case 0x6a:
      break;
    case 0x6c:
      goto switchD_00106f05_caseD_6c;
    }
  }
  x = 0x14;
  iVar5 = 0;
LAB_00106f68:
  XInputSimulator::mouseMoveRelative(this,x,iVar5);
switchD_00106f05_caseD_68:
  if (_Var2 == 1) {
    if (_Var1 == 0x52) {
      XInputSimulator::mouseClick(this,3);
    }
    else if (_Var1 == 0x4c) {
      XInputSimulator::mouseClick(this,1);
    }
    else {
LAB_00106f91:
      if (_Var1 == 0x61 && _Var2 == 1) {
        enabled = (bool)(enabled ^ 1);
      }
    }
  }
  goto LAB_00106ea4;
}

Assistant:

int main_p(int argc, char **argv)
{
    on_exit(exit_cleanup, NULL);

    process_command_line_arguments(argc, argv);

    if (geteuid()) error(EXIT_FAILURE, errno, "Got r00t?");
    // kill existing logkeys process
    if (args.kill) kill_existing_process();

    // if neither start nor export, that must be an error
    if (!args.start && !(args.flags & FLAG_EXPORT_KEYMAP)) { usage(); exit(EXIT_FAILURE); }

    // if posting remote and post_size not set, set post_size to default [500K bytes]
    if (args.post_size == 0 && (!args.http_url.empty() || !args.irc_server.empty())) {
        args.post_size = 500000;
    }

    // check for incompatible flags
    if (!args.keymap.empty() && (!(args.flags & FLAG_EXPORT_KEYMAP) && args.us_keymap)) {             // exporting uses args.keymap also
        error(EXIT_FAILURE, 0, "Incompatible flags '-m' and '-u'. See usage.");
    }

    // check for incompatible flags: if posting remote and output is set to stdout
    if (args.post_size != 0 && ( args.logfile == "-" )) {
        error(EXIT_FAILURE, 0, "Incompatible flags [--post-size | --post-http] and --output to stdout");
    }

    set_utf8_locale();

    if (args.flags & FLAG_EXPORT_KEYMAP) {
        if (!args.us_keymap)
            determine_system_keymap();
        export_keymap_to_file();
        // = exit(0)
    }
    else if (!args.keymap.empty())             // custom keymap in use
        parse_input_keymap();
    else
        determine_system_keymap();

    if (args.device.empty()) {             // no device given with -d switch
        determine_input_device();
    }
    else {             // event device supplied as -d argument
        std::string::size_type i = args.device.find_last_of('/');
        args.device = (std::string(INPUT_EVENT_PATH) + args.device.substr(i == std::string::npos ? 0 : i + 1));
    }

    set_signal_handling();

    close(STDIN_FILENO);
    // leave stderr open

    // open input device for reading
    input_fd = open(args.device.c_str(), O_RDONLY);
    if (input_fd == -1) {
        error(EXIT_FAILURE, errno, "Error opening input event device '%s'", args.device.c_str());
    }

    // if log file is other than default, then better seteuid() to the getuid() in order to ensure user can't write to where she shouldn't!
    if (args.logfile == DEFAULT_LOG_FILE) {
        seteuid(getuid());
        setegid(getgid());
    }

    // mouskee
    XInputSimulator &sim = XInputSimulator::getInstance();
    // mouskee

    // open log file (if file doesn't exist, create it with safe 0600 permissions)
    umask(0177);

    if (access(PID_FILE, F_OK) != -1)             // PID file already exists
        error(EXIT_FAILURE, errno, "Another process already running? Quitting. (" PID_FILE ")");

    if (!(args.flags & FLAG_NO_DAEMON)) {
        int noclose = 1;                         // don't close streams (stderr used)
        if (daemon(0, noclose) == -1)                         // become daemon
            error(EXIT_FAILURE, errno, "Failed to become daemon");
    }

    // now we need those privileges back in order to create system-wide PID_FILE
    seteuid(0); setegid(0);
    if (!(args.flags & FLAG_NO_DAEMON)) {
        create_PID_file();
    }

    unsigned int scan_code, prev_code = 0;             // the key code of the pressed key (some codes are from "scan code set 1", some are different (see <linux/input.h>)
    struct input_event event;
    bool capslock_in_effect = execute(COMMAND_STR_CAPSLOCK_STATE).size() >= 2;
    bool shift_in_effect = false;
    bool altgr_in_effect = false;
    bool ctrl_in_effect = false;             // used for identifying Ctrl+C / Ctrl+D

    // infinite loop: exit gracefully by receiving SIGHUP, SIGINT or SIGTERM (of which handler closes input_fd)
    while (read(input_fd, &event, sizeof(struct input_event)) > 0) {

// these event.value-s aren't defined in <linux/input.h> ?
#define EV_MAKE   1  // when key pressed
#define EV_BREAK  0  // when key released
#define EV_REPEAT 2  // when key switches to repeating after short delay

        if (event.type != EV_KEY) continue;                         // keyboard events are always of type EV_KEY

        scan_code = event.code;
        // on key repeat ; must check before on key press
        // on key press
        if (enabled) {
            if (event.value == EV_REPEAT || event.value == EV_MAKE) {
                if (scan_code == KEY_UP || scan_code == KEY_KP8)
                    sim.mouseMoveRelative(0, -20);

                if (scan_code == KEY_DOWN || scan_code == KEY_KP2)
                    sim.mouseMoveRelative(0, 20);

                if (scan_code == KEY_LEFT || scan_code == KEY_KP4)
                    sim.mouseMoveRelative(-20, 0);

                if (scan_code == KEY_RIGHT || scan_code == KEY_KP6)
                    sim.mouseMoveRelative(20, 0);
            }

            if (event.value == EV_MAKE) {
                if (scan_code == KEY_KP5)
                    sim.mouseClick(XIS::LEFT_MOUSE_BUTTON);
                if (scan_code == KEY_KP0)
                    sim.mouseClick(XIS::RIGHT_MOUSE_BUTTON);
            }
            // on key release
            if (event.value == EV_BREAK) {
                if (scan_code == KEY_LEFTSHIFT || scan_code == KEY_RIGHTSHIFT)
                    shift_in_effect = false;
                if (scan_code == KEY_RIGHTALT)
                    altgr_in_effect = false;
                if (scan_code == KEY_LEFTCTRL || scan_code == KEY_RIGHTCTRL) {
                    ctrl_in_effect = false;
                }
            }
        }

        if (event.value == EV_MAKE) {
            if (scan_code == KEY_RIGHTCTRL)
                enabled = !enabled;
        }
    }
    exit(EXIT_SUCCESS);
}